

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O1

void __thiscall
chrono::
ChValueSpecific<std::vector<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>_>
::CallOut(ChValueSpecific<std::vector<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>_>
          *this,ChArchiveOut *marchive)

{
  pointer pcVar1;
  ChNameValue<std::vector<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>_>
  local_18;
  
  pcVar1 = (this->super_ChValue)._name._M_dataplus._M_p;
  local_18._value = this->_ptr_to_val;
  local_18._name = "*this->_ptr_to_val";
  if (pcVar1 != (pointer)0x0) {
    local_18._name = pcVar1;
  }
  local_18._flags = '\0';
  ChArchiveOut::out<chrono::ChVector2<double>>(marchive,&local_18);
  return;
}

Assistant:

void ChValueSpecific<TClass>::CallOut(ChArchiveOut& marchive) {
          marchive.out(CHNVP(*this->_ptr_to_val,this->_name.c_str()));
}